

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void setnodevector(lua_State *L,Table *t,uint size)

{
  uint uVar1;
  Node *pNVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  
  if (size == 0) {
    t->node = &dummynode_;
    t->lsizenode = '\0';
    pNVar2 = (Node *)0x0;
  }
  else {
    uVar1 = luaO_ceillog2(size);
    if (0x1e < uVar1) {
      luaG_runerror(L,"table overflow");
    }
    bVar3 = (byte)uVar1;
    uVar4 = (ulong)(uint)(1 << (bVar3 & 0x1f));
    pNVar2 = (Node *)luaM_malloc_(L,0x18L << (bVar3 & 0x3f),0);
    t->node = pNVar2;
    for (lVar5 = 0; uVar4 * 0x18 - lVar5 != 0; lVar5 = lVar5 + 0x18) {
      pNVar2 = t->node;
      *(undefined4 *)((long)pNVar2 + lVar5 + 0xc) = 0;
      *(undefined2 *)((long)pNVar2 + lVar5 + 8) = 0x10;
    }
    t->lsizenode = bVar3;
    pNVar2 = t->node + uVar4;
  }
  t->lastfree = pNVar2;
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, unsigned int size) {
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common 'dummynode' */
    t->lsizenode = 0;
    t->lastfree = NULL;  /* signal that it is using dummy node */
  }
  else {
    int i;
    int lsize = luaO_ceillog2(size);
    if (lsize > MAXHBITS || (1u << lsize) > MAXHSIZE)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i = 0; i < cast_int(size); i++) {
      Node *n = gnode(t, i);
      gnext(n) = 0;
      setnilkey(n);
      setempty(gval(n));
    }
    t->lsizenode = cast_byte(lsize);
    t->lastfree = gnode(t, size);  /* all positions are free */
  }
}